

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.h
# Opt level: O1

int msgpack_sbuffer_write(void *data,char *buf,size_t len)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong __size;
  
  lVar1 = *(long *)((long)data + 0x10);
  if ((ulong)(lVar1 - *data) < len) {
    uVar5 = 0x2000;
    if (lVar1 != 0) {
      uVar5 = lVar1 * 2;
    }
    uVar3 = *data + len;
    do {
      __size = uVar5;
      if (uVar3 <= uVar5) break;
      bVar2 = 0 < (long)uVar5;
      uVar5 = uVar5 * 2;
      __size = uVar3;
    } while (bVar2);
    pvVar4 = realloc(*(void **)((long)data + 8),__size);
    if (pvVar4 == (void *)0x0) {
      return -1;
    }
    *(void **)((long)data + 8) = pvVar4;
    *(ulong *)((long)data + 0x10) = __size;
  }
  memcpy((void *)(*(long *)((long)data + 8) + *data),buf,len);
  *(size_t *)data = *data + len;
  return 0;
}

Assistant:

static inline int msgpack_sbuffer_write(void* data, const char* buf, size_t len)
{
    msgpack_sbuffer* sbuf = (msgpack_sbuffer*)data;

    if(sbuf->alloc - sbuf->size < len) {
        void* tmp;
        size_t nsize = (sbuf->alloc) ?
                sbuf->alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < sbuf->size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = sbuf->size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        tmp = realloc(sbuf->data, nsize);
        if(!tmp) { return -1; }

        sbuf->data = (char*)tmp;
        sbuf->alloc = nsize;
    }

    memcpy(sbuf->data + sbuf->size, buf, len);
    sbuf->size += len;
    return 0;
}